

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_PrintPatch(Acb_Ntk_t *pNtkF,Vec_Int_t *vDivs,Vec_Int_t *vUsed,abctime clk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  abctime aVar5;
  abctime time;
  int i;
  
  printf("Patch has %d inputs: ");
  for (i = 0; i < vUsed->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vUsed,i);
    iVar1 = Vec_IntEntry(vDivs,iVar1);
    uVar2 = Vec_IntEntry(vUsed,i);
    pcVar4 = Acb_ObjNameStr(pNtkF,iVar1);
    uVar3 = Acb_ObjWeight(pNtkF,iVar1);
    printf("%d=%s(w=%d) ",(ulong)uVar2,pcVar4,(ulong)uVar3);
    Acb_ObjWeight(pNtkF,iVar1);
  }
  printf("\nTotal weight = %d  ");
  aVar5 = Abc_Clock();
  Abc_PrintTime(0x79ba37,(char *)(aVar5 - clk),time);
  putchar(10);
  return;
}

Assistant:

void Acb_PrintPatch( Acb_Ntk_t * pNtkF, Vec_Int_t * vDivs, Vec_Int_t * vUsed, abctime clk )
{
    int i, iObj, Weight = 0;
    printf( "Patch has %d inputs: ", Vec_IntSize(vUsed) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
    {
        printf( "%d=%s(w=%d) ", Vec_IntEntry(vUsed, i), Acb_ObjNameStr(pNtkF, iObj), Acb_ObjWeight(pNtkF, iObj) );
        Weight += Acb_ObjWeight(pNtkF, iObj);
    }
    printf( "\nTotal weight = %d  ", Weight );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    printf( "\n" );
}